

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls.c
# Opt level: O1

int cvNlsLSetup(int jbad,int *jcur,void *cvode_mem)

{
  int iVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xfb,"cvNlsLSetup",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    if (jbad != 0) {
      *(undefined4 *)((long)cvode_mem + 0x780) = 1;
    }
    iVar1 = (**(code **)((long)cvode_mem + 0x7c8))
                      (cvode_mem,*(undefined4 *)((long)cvode_mem + 0x780),
                       *(undefined8 *)((long)cvode_mem + 0x1c0),
                       *(undefined8 *)((long)cvode_mem + 0x1d8),(long)cvode_mem + 0x820,
                       *(undefined8 *)((long)cvode_mem + 0x1e0),
                       *(undefined4 *)((long)cvode_mem + 0x1e8),
                       *(undefined4 *)((long)cvode_mem + 0x1f0));
    *(long *)((long)cvode_mem + 0x6c8) = *(long *)((long)cvode_mem + 0x6c8) + 1;
    *jcur = *(int *)((long)cvode_mem + 0x820);
    *(undefined4 *)((long)cvode_mem + 0x7f8) = 0;
    *(undefined8 *)((long)cvode_mem + 0x530) = *(undefined8 *)((long)cvode_mem + 0x528);
    *(undefined8 *)((long)cvode_mem + 0x538) = 0x3ff0000000000000;
    *(undefined8 *)((long)cvode_mem + 0x540) = 0x3ff0000000000000;
    *(undefined8 *)((long)cvode_mem + 0x548) = 0x3ff0000000000000;
    *(undefined8 *)((long)cvode_mem + 0x800) = *(undefined8 *)((long)cvode_mem + 0x628);
    if (iVar1 < 0) {
      iVar2 = -6;
    }
    else {
      iVar2 = 0x386;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsLSetup(sunbooleantype jbad, sunbooleantype* jcur, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* if the nonlinear solver marked the Jacobian as bad update convfail */
  if (jbad) { cv_mem->convfail = CV_FAIL_BAD_J; }

  /* setup the linear solver */
  retval = cv_mem->cv_lsetup(cv_mem, cv_mem->convfail, cv_mem->cv_y,
                             cv_mem->cv_ftemp, &(cv_mem->cv_jcur),
                             cv_mem->cv_vtemp1, cv_mem->cv_vtemp2,
                             cv_mem->cv_vtemp3);
  cv_mem->cv_nsetups++;

  /* update Jacobian status */
  *jcur = cv_mem->cv_jcur;

  cv_mem->cv_forceSetup = SUNFALSE;
  cv_mem->cv_gamrat     = ONE;
  cv_mem->cv_gammap     = cv_mem->cv_gamma;
  cv_mem->cv_crate      = ONE;
  cv_mem->cv_crateS     = ONE;
  cv_mem->cv_nstlp      = cv_mem->cv_nst;

  if (retval < 0) { return (CV_LSETUP_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}